

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O1

string * __thiscall
cmGlobalUnixMakefileGenerator3::ConvertToMakefilePath
          (string *__return_storage_ptr__,cmGlobalUnixMakefileGenerator3 *this,string *path)

{
  byte bVar1;
  size_type sVar2;
  pointer pcVar3;
  size_type sVar4;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  sVar2 = path->_M_string_length;
  if (sVar2 != 0) {
    pcVar3 = (path->_M_dataplus)._M_p;
    sVar4 = 0;
    do {
      bVar1 = pcVar3[sVar4];
      if (bVar1 < 0x24) {
        if ((bVar1 == 0x20) || (bVar1 == 0x23)) {
LAB_0046d305:
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
        }
LAB_0046d312:
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      else {
        if (bVar1 != 0x24) {
          if (bVar1 == 0x5c) goto LAB_0046d305;
          if (bVar1 != 0x3d) goto LAB_0046d312;
        }
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      sVar4 = sVar4 + 1;
    } while (sVar2 != sVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalUnixMakefileGenerator3::ConvertToMakefilePath(
  std::string const& path) const
{
#if defined(_WIN32) && !defined(__CYGWIN__)
  if (!this->ForceUnixPaths) {
    return ConvertToMakefilePathForWindows(path);
  }
#endif
  return ConvertToMakefilePathForUnix(path);
}